

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdist.c
# Opt level: O0

void qdist_bin__internal(qdist *to,qdist *from,size_t n)

{
  qdist_entry *pqVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool local_6a;
  qdist_entry *o;
  double right;
  double left;
  double x;
  size_t j;
  size_t i;
  double step;
  double xmax;
  double xmin;
  size_t n_local;
  qdist *from_local;
  qdist *to_local;
  
  qdist_init(to);
  if (from->n != 0) {
    if ((n == 0) || (xmin = (double)n, from->n == 1)) {
      xmin = (double)from->n;
    }
    dVar3 = qdist_xmin(from);
    dVar4 = qdist_xmax(from);
    auVar9._8_4_ = (int)((ulong)xmin >> 0x20);
    auVar9._0_8_ = xmin;
    auVar9._12_4_ = 0x45300000;
    dVar4 = (dVar4 - dVar3) /
            ((auVar9._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,SUB84(xmin,0)) - 4503599627370496.0));
    if (xmin == (double)from->n) {
      for (j = 0; j < from->n; j = j + 1) {
        dVar5 = from->entries[j].x;
        auVar10._8_4_ = (int)(j >> 0x20);
        auVar10._0_8_ = j;
        auVar10._12_4_ = 0x45300000;
        dVar8 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)j) - 4503599627370496.0)) * dVar4 + dVar3;
        if ((dVar5 != dVar8) || (NAN(dVar5) || NAN(dVar8))) goto LAB_0135895e;
      }
      pqVar1 = (qdist_entry *)g_realloc_n(to->entries,(gsize)xmin,0x10);
      to->entries = pqVar1;
      to->n = from->n;
      memcpy(to->entries,from->entries,to->n << 4);
    }
    else {
LAB_0135895e:
      x = 0.0;
      for (j = 0; j < (ulong)xmin; j = j + 1) {
        auVar6._8_4_ = (int)(j >> 0x20);
        auVar6._0_8_ = j;
        auVar6._12_4_ = 0x45300000;
        dVar5 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)j) - 4503599627370496.0)) * dVar4 + dVar3;
        lVar2 = j + 1;
        auVar7._8_4_ = (int)((ulong)lVar2 >> 0x20);
        auVar7._0_8_ = lVar2;
        auVar7._12_4_ = 0x45300000;
        qdist_add(to,dVar5,0);
        while( true ) {
          local_6a = false;
          if ((ulong)x < from->n) {
            local_6a = from->entries[(long)x].x <
                       ((auVar7._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) * dVar4 +
                       dVar3 || j == (long)xmin - 1U;
          }
          if (!local_6a) break;
          qdist_add(to,dVar5,from->entries[(long)x].count);
          x = (double)((long)x + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void qdist_bin__internal(struct qdist *to, const struct qdist *from, size_t n)
{
    double xmin, xmax;
    double step;
    size_t i, j;

    qdist_init(to);

    if (from->n == 0) {
        return;
    }
    if (n == 0 || from->n == 1) {
        n = from->n;
    }

    /* set equally-sized bins between @from's left and right */
    xmin = qdist_xmin(from);
    xmax = qdist_xmax(from);
    step = (xmax - xmin) / n;

    if (n == from->n) {
        /* if @from's entries are equally spaced, no need to re-bin */
        for (i = 0; i < from->n; i++) {
            if (from->entries[i].x != xmin + i * step) {
                goto rebin;
            }
        }
        /* they're equally spaced, so copy the dist and bail out */
        to->entries = g_renew(struct qdist_entry, to->entries, n);
        to->n = from->n;
        memcpy(to->entries, from->entries, sizeof(*to->entries) * to->n);
        return;
    }

 rebin:
    j = 0;
    for (i = 0; i < n; i++) {
        double x;
        double left, right;

        left = xmin + i * step;
        right = xmin + (i + 1) * step;

        /* Add x, even if it might not get any counts later */
        x = left;
        qdist_add(to, x, 0);

        /*
         * To avoid double-counting we capture [left, right) ranges, except for
         * the righmost bin, which captures a [left, right] range.
         */
        while (j < from->n && (from->entries[j].x < right || i == n - 1)) {
            struct qdist_entry *o = &from->entries[j];

            qdist_add(to, x, o->count);
            j++;
        }
    }
}